

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O3

UBool __thiscall
icu_63::MessagePattern::copyStorage
          (MessagePattern *this,MessagePattern *other,UErrorCode *errorCode)

{
  MessagePatternList<icu_63::MessagePattern::Part,_32> *this_00;
  Part *pPVar1;
  MessagePatternList<double,_8> *this_01;
  double *pdVar2;
  int length;
  MessagePattern *other_00;
  
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  this->parts = (Part *)0x0;
  this->partsLength = 0;
  this->numericValues = (double *)0x0;
  this->numericValuesLength = 0;
  this_00 = &this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>;
  other_00 = other;
  if (this_00 == (MessagePatternList<icu_63::MessagePattern::Part,_32> *)0x0) {
    this_00 = (MessagePatternList<icu_63::MessagePattern::Part,_32> *)
              UMemory::operator_new((UMemory *)0x210,(size_t)other);
    if (this_00 != (MessagePatternList<icu_63::MessagePattern::Part,_32> *)0x0) {
      other_00 = (MessagePattern *)0x0;
      memset(&(this_00->a).capacity,0,0x208);
      pPVar1 = (this_00->a).stackArray;
      ((MaybeStackArray<icu_63::MessagePattern::Part,_32> *)&(this_00->a).ptr)->ptr = pPVar1;
      (this_00->a).capacity = 0x20;
      this->partsList = (MessagePatternPartsList *)this_00;
      this->parts = pPVar1;
      goto LAB_0029ac72;
    }
    this->partsList = (MessagePatternPartsList *)0x0;
LAB_0029ad3c:
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
LAB_0029ac72:
    if (0 < other->partsLength) {
      other_00 = (MessagePattern *)other->partsList;
      MessagePatternList<icu_63::MessagePattern::Part,_32>::copyFrom
                (this_00,(MessagePatternList<icu_63::MessagePattern::Part,_32> *)other_00,
                 other->partsLength,errorCode);
      if (U_ZERO_ERROR < *errorCode) {
        return '\0';
      }
      this->parts = (this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.
                    ptr;
      this->partsLength = other->partsLength;
    }
    length = other->numericValuesLength;
    if (length < 1) {
      return '\x01';
    }
    this_01 = &this->numericValuesList->super_MessagePatternList<double,_8>;
    if (this_01 == (MessagePatternList<double,_8> *)0x0) {
      this_01 = (MessagePatternList<double,_8> *)
                UMemory::operator_new((UMemory *)0x50,(size_t)other_00);
      if (this_01 == (MessagePatternList<double,_8> *)0x0) {
        this->numericValuesList = (MessagePatternDoubleList *)0x0;
        goto LAB_0029ad3c;
      }
      (this_01->a).capacity = 0;
      (this_01->a).needToRelease = '\0';
      *(undefined3 *)&(this_01->a).field_0xd = 0;
      (this_01->a).stackArray[0] = 0.0;
      (this_01->a).stackArray[5] = 0.0;
      (this_01->a).stackArray[6] = 0.0;
      (this_01->a).stackArray[3] = 0.0;
      (this_01->a).stackArray[4] = 0.0;
      (this_01->a).stackArray[1] = 0.0;
      (this_01->a).stackArray[2] = 0.0;
      (this_01->a).stackArray[7] = 0.0;
      pdVar2 = (this_01->a).stackArray;
      ((MaybeStackArray<double,_8> *)&(this_01->a).ptr)->ptr = pdVar2;
      (this_01->a).capacity = 8;
      this->numericValuesList = (MessagePatternDoubleList *)this_01;
      this->numericValues = pdVar2;
      length = other->numericValuesLength;
    }
    MessagePatternList<double,_8>::copyFrom
              (this_01,&other->numericValuesList->super_MessagePatternList<double,_8>,length,
               errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      this->numericValues = (this->numericValuesList->super_MessagePatternList<double,_8>).a.ptr;
      this->numericValuesLength = other->numericValuesLength;
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

UBool
MessagePattern::copyStorage(const MessagePattern &other, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return FALSE;
    }
    parts=NULL;
    partsLength=0;
    numericValues=NULL;
    numericValuesLength=0;
    if(partsList==NULL) {
        partsList=new MessagePatternPartsList();
        if(partsList==NULL) {
            errorCode=U_MEMORY_ALLOCATION_ERROR;
            return FALSE;
        }
        parts=partsList->a.getAlias();
    }
    if(other.partsLength>0) {
        partsList->copyFrom(*other.partsList, other.partsLength, errorCode);
        if(U_FAILURE(errorCode)) {
            return FALSE;
        }
        parts=partsList->a.getAlias();
        partsLength=other.partsLength;
    }
    if(other.numericValuesLength>0) {
        if(numericValuesList==NULL) {
            numericValuesList=new MessagePatternDoubleList();
            if(numericValuesList==NULL) {
                errorCode=U_MEMORY_ALLOCATION_ERROR;
                return FALSE;
            }
            numericValues=numericValuesList->a.getAlias();
        }
        numericValuesList->copyFrom(
            *other.numericValuesList, other.numericValuesLength, errorCode);
        if(U_FAILURE(errorCode)) {
            return FALSE;
        }
        numericValues=numericValuesList->a.getAlias();
        numericValuesLength=other.numericValuesLength;
    }
    return TRUE;
}